

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::time::writer<std::wostream>
          (time *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  time_t clock;
  size_t sVar1;
  size_t sVar2;
  wostream *pwVar3;
  undefined8 local_d0;
  char local_c8 [8];
  char time_str [100];
  undefined1 local_58 [8];
  tm tm;
  bool fallback;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  time *this_local;
  
  tm.tm_zone._7_1_ = 1;
  local_d0 = this;
  clock = milliseconds_to_time(this);
  gm_time((tm *)local_58,clock);
  sVar1 = strftime(local_c8,100,"%FT%TZ",(tm *)local_58);
  if (sVar1 != 0) {
    sVar2 = array_elements<char,100ul>((char (*) [100])local_c8);
    local_c8[sVar2 - 1] = '\0';
    std::operator<<(os,local_c8);
    tm.tm_zone._7_1_ = 0;
  }
  if ((tm.tm_zone._7_1_ & 1) != 0) {
    pwVar3 = std::operator<<(os,"Time(");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,local_d0->ms_);
    std::operator<<(pwVar3,"ms)");
  }
  return os;
}

Assistant:

OStream & time::writer (OStream & os) const {
            bool fallback = true;
            std::tm const tm = gm_time (this->milliseconds_to_time ());
            char time_str[100];
            // strftime() returns 0 if the result doesn't fit in the provided buffer;
            // the contents are undefined. 100 characters should be plenty for an ISO8601 date.
            if (std::strftime (time_str, sizeof (time_str), "%FT%TZ", &tm) != 0) {
                // Guarantee that the string is null terminated.
                time_str[array_elements (time_str) - 1] = '\0';
                os << time_str;
                fallback = false;
            }

            if (fallback) {
                os << "Time(" << ms_ << "ms)";
            }
            return os;
        }